

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chapter3.cpp
# Opt level: O2

void chapter3::user_query
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                *word_count)

{
  bool bVar1;
  const_iterator cVar2;
  ostream *poVar3;
  char *pcVar4;
  string search_word;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  std::operator<<((ostream *)&std::cout,"Please enter a word to search (q to quit): ");
  std::operator>>((istream *)&std::cin,(string *)&local_50);
  while( true ) {
    bVar1 = std::operator!=(&local_50,"q");
    if (!bVar1 || local_50._M_string_length == 0) break;
    cVar2 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
            ::find(&word_count->_M_t,&local_50);
    poVar3 = (ostream *)&std::cout;
    pcVar4 = "Not found!";
    if ((_Rb_tree_header *)cVar2._M_node != &(word_count->_M_t)._M_impl.super__Rb_tree_header) {
      poVar3 = std::operator<<((ostream *)&std::cout,"Found ");
      poVar3 = std::operator<<(poVar3,(string *)(cVar2._M_node + 1));
      poVar3 = std::operator<<(poVar3," ");
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,cVar2._M_node[2]._M_color);
      pcVar4 = " times";
    }
    poVar3 = std::operator<<(poVar3,pcVar4);
    std::endl<char,std::char_traits<char>>(poVar3);
    std::operator<<((ostream *)&std::cout,"Another search (q to quit): ");
    std::operator>>((istream *)&std::cin,(string *)&local_50);
  }
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

inline void chapter3::user_query(const map<string, int> &word_count) {
    string search_word;
    cout << "Please enter a word to search (q to quit): ";
    cin >> search_word;

    while (search_word != "q" && search_word.size()) {
        map<string, int>::const_iterator itr;
        if ((itr = word_count.find(search_word)) != word_count.end()) {
            cout << "Found "
                 << itr->first
                 << " "
                 << itr-> second
                 << " times" << endl;
        } else {
            cout << "Not found!" << endl;
        }

        cout << "Another search (q to quit): ";
        cin >> search_word;
    }
}